

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_lib.cc
# Opt level: O3

int ASN1_get_object(uchar **pp,long *plength,int *ptag,int *pclass,long omax)

{
  int iVar1;
  uint uVar2;
  CBS_ASN1_TAG tag;
  CBS body;
  CBS cbs;
  uint local_44;
  CBS local_40;
  CBS local_30;
  
  if (omax < 0) {
    iVar1 = 0x4d;
  }
  else {
    local_30.data = *pp;
    local_30.len = omax;
    iVar1 = CBS_get_any_asn1(&local_30,&local_40,&local_44);
    if ((iVar1 == 0) || (0x3fffffff < local_40.len)) {
      iVar1 = 0x58;
    }
    else {
      uVar2 = local_44 >> 0x18 & 0xc0;
      if ((local_44 & 0x1fffffff) < 0x100 || uVar2 != 0) {
        *pp = local_40.data;
        *plength = local_40.len;
        *ptag = local_44 & 0x1fffffff;
        *pclass = uVar2;
        return local_44 >> 0x18 & 0x20;
      }
      iVar1 = 99;
    }
  }
  ERR_put_error(0xc,0,0x7b,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_lib.cc"
                ,iVar1);
  return 0x80;
}

Assistant:

int ASN1_get_object(const unsigned char **inp, long *out_len, int *out_tag,
                    int *out_class, long in_len) {
  if (in_len < 0) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_HEADER_TOO_LONG);
    return 0x80;
  }

  CBS_ASN1_TAG tag;
  CBS cbs, body;
  CBS_init(&cbs, *inp, (size_t)in_len);
  if (!CBS_get_any_asn1(&cbs, &body, &tag) ||
      // Bound the length to comfortably fit in an int. Lengths in this
      // module often switch between int and long without overflow checks.
      CBS_len(&body) > INT_MAX / 2) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_HEADER_TOO_LONG);
    return 0x80;
  }

  // Convert between tag representations.
  int tag_class = (tag & CBS_ASN1_CLASS_MASK) >> CBS_ASN1_TAG_SHIFT;
  int constructed = (tag & CBS_ASN1_CONSTRUCTED) >> CBS_ASN1_TAG_SHIFT;
  int tag_number = tag & CBS_ASN1_TAG_NUMBER_MASK;

  // To avoid ambiguity with V_ASN1_NEG, impose a limit on universal tags.
  if (tag_class == V_ASN1_UNIVERSAL && tag_number > V_ASN1_MAX_UNIVERSAL) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_HEADER_TOO_LONG);
    return 0x80;
  }

  *inp = CBS_data(&body);
  *out_len = CBS_len(&body);
  *out_tag = tag_number;
  *out_class = tag_class;
  return constructed;
}